

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederateExport.cpp
# Opt level: O1

void helicsEndpointSetTag(HelicsEndpoint end,char *tagname,char *tagvalue,HelicsError *err)

{
  Interface *this;
  undefined8 *puVar1;
  size_t sVar2;
  size_t sVar3;
  _Alloc_hider _Var4;
  _Alloc_hider _Var5;
  bool bVar6;
  string_view tag;
  string_view value;
  
  if ((err == (HelicsError *)0x0) || (err->error_code == 0)) {
    if (end == (HelicsEndpoint)0x0) {
      if (err == (HelicsError *)0x0) goto LAB_001af278;
    }
    else {
      bVar6 = *(int *)((long)end + 0x20) == -0x4bac6b3e;
      puVar1 = (undefined8 *)0x0;
      if (bVar6) {
        puVar1 = (undefined8 *)end;
      }
      if (bVar6 || err == (HelicsError *)0x0) goto LAB_001af27a;
    }
    err->error_code = -3;
    err->message = "The given endpoint does not point to a valid object";
  }
LAB_001af278:
  puVar1 = (undefined8 *)0x0;
LAB_001af27a:
  if (puVar1 != (undefined8 *)0x0) {
    this = (Interface *)*puVar1;
    sVar2 = gHelicsEmptyStr_abi_cxx11_._M_string_length;
    _Var5._M_p = gHelicsEmptyStr_abi_cxx11_._M_dataplus._M_p;
    if (tagname != (char *)0x0) {
      sVar2 = strlen(tagname);
      _Var5._M_p = tagname;
    }
    sVar3 = gHelicsEmptyStr_abi_cxx11_._M_string_length;
    _Var4._M_p = gHelicsEmptyStr_abi_cxx11_._M_dataplus._M_p;
    if (tagvalue != (char *)0x0) {
      sVar3 = strlen(tagvalue);
      _Var4._M_p = tagvalue;
    }
    tag._M_str = _Var5._M_p;
    tag._M_len = sVar2;
    value._M_str = _Var4._M_p;
    value._M_len = sVar3;
    helics::Interface::setTag(this,tag,value);
  }
  return;
}

Assistant:

void helicsEndpointSetTag(HelicsEndpoint end, const char* tagname, const char* tagvalue, HelicsError* err)
{
    auto* endObj = verifyEndpoint(end, err);
    if (endObj == nullptr) {
        return;
    }
    try {
        endObj->endPtr->setTag(AS_STRING_VIEW(tagname), AS_STRING_VIEW(tagvalue));
    }
    // LCOV_EXCL_START
    catch (...) {
        helicsErrorHandler(err);
    }
    // LCOV_EXCL_STOP
}